

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstExpr.h
# Opt level: O0

void __thiscall
nigel::AstVariable::AstVariable
          (AstVariable *this,MemModel model,String *name,u8 address,BasicType type)

{
  BasicType type_local;
  u8 address_local;
  String *name_local;
  MemModel model_local;
  AstVariable *this_local;
  
  AstReturning::AstReturning(&this->super_AstReturning,variable);
  (this->super_AstReturning).super_AstExpr._vptr_AstExpr = (_func_int **)&PTR__AstVariable_002b53f8;
  *(undefined4 *)&(this->super_AstReturning).field_0x34 = 1;
  std::__cxx11::string::string((string *)&this->name);
  this->scopeOffset = 0;
  this->predefinedAddress = '\0';
  *(MemModel *)&(this->super_AstReturning).field_0x34 = model;
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  this->predefinedAddress = address;
  (this->super_AstReturning).retType = type;
  return;
}

Assistant:

AstVariable( MemModel model, String name, u8 address, BasicType type ) : AstReturning( AstExpr::Type::variable )
		{
			this->model = model;
			this->name = name;
			predefinedAddress = address;
			retType = type;
		}